

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O1

bool __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false>::insert_media
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false> *this,Media *media)

{
  shared_ptr<Storage::Disk::Disk> *disk;
  Card *pCVar1;
  shared_ptr<Storage::MassStorage::MassStorageDevice> *device;
  DiskIICard *this_00;
  SCSICard *this_01;
  
  disk = (media->disks).
         super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if (disk != (media->disks).
              super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
    pCVar1 = (this->cards_)._M_elems[5]._M_t.
             super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
             super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
             super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl;
    if (pCVar1 == (Card *)0x0) {
      this_00 = (DiskIICard *)0x0;
    }
    else {
      this_00 = (DiskIICard *)__dynamic_cast(pCVar1,&Card::typeinfo,&DiskIICard::typeinfo,0);
    }
    if (this_00 != (DiskIICard *)0x0) {
      DiskIICard::set_disk(this_00,disk,0);
    }
  }
  device = (media->mass_storage_devices).
           super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (device != (media->mass_storage_devices).
                super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pCVar1 = (this->cards_)._M_elems[6]._M_t.
             super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
             super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
             super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl;
    if (pCVar1 == (Card *)0x0) {
      this_01 = (SCSICard *)0x0;
    }
    else {
      this_01 = (SCSICard *)__dynamic_cast(pCVar1,&Card::typeinfo,&SCSICard::typeinfo,0);
    }
    if (this_01 != (SCSICard *)0x0) {
      SCSICard::set_storage_device(this_01,device);
    }
  }
  return true;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(!media.disks.empty()) {
				auto diskii = diskii_card();
				if(diskii) diskii->set_disk(media.disks[0], 0);
			}

			if(!media.mass_storage_devices.empty()) {
				auto scsi = scsi_card();
				if(scsi) scsi->set_storage_device(media.mass_storage_devices[0]);
			}

			return true;
		}